

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.hpp
# Opt level: O0

string * __thiscall
ghc::options::consumeOption_abi_cxx11_
          (string *__return_storage_ptr__,options *this,option_info *optinfo)

{
  type tVar1;
  bool bVar2;
  ulong uVar3;
  char *pcVar4;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78 [32];
  string local_58 [55];
  undefined1 local_21;
  option_info *local_20;
  option_info *optinfo_local;
  options *this_local;
  string *arg;
  
  local_21 = 0;
  local_20 = optinfo;
  optinfo_local = (option_info *)this;
  this_local = (options *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  tVar1 = local_20->_type;
  if (tVar1 == no_arg) {
    bVar2 = is_short_option(this,&this->_current);
    if ((bVar2) && (uVar3 = std::__cxx11::string::length(), 2 < uVar3)) {
      std::__cxx11::string::erase((ulong)&this->_current,1);
    }
    else {
      nextArg(this,1);
    }
  }
  else if (tVar1 == arg_optional) {
    bVar2 = is_short_option(this,&this->_current);
    if ((bVar2) && (uVar3 = std::__cxx11::string::length(), 2 < uVar3)) {
      std::__cxx11::string::substr((ulong)local_58,(ulong)&this->_current);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_58);
      std::__cxx11::string::~string(local_58);
      nextArg(this,1);
    }
    else {
      uVar3 = std::__cxx11::string::empty();
      if (((uVar3 & 1) == 0) &&
         (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&this->_next), *pcVar4 != '-')) {
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&this->_next);
        nextArg(this,2);
      }
      else {
        nextArg(this,1);
      }
    }
  }
  else if (tVar1 == arg_needed) {
    bVar2 = is_short_option(this,&this->_current);
    if ((bVar2) && (uVar3 = std::__cxx11::string::length(), 2 < uVar3)) {
      std::__cxx11::string::substr((ulong)local_78,(ulong)&this->_current);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_78);
      std::__cxx11::string::~string(local_78);
      nextArg(this,1);
    }
    else {
      uVar3 = std::__cxx11::string::empty();
      if (((uVar3 & 1) == 0) &&
         (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&this->_next), *pcVar4 != '-')) {
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&this->_next);
        nextArg(this,2);
      }
      else {
        bVar2 = std::function::operator_cast_to_bool((function *)&this->_missing_argument_hamdler);
        if (!bVar2) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::operator+(&local_98,"Missing argument for option: ",&local_20->_name);
          std::runtime_error::runtime_error(this_00,(string *)&local_98);
          __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        std::
        function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::operator()(&this->_missing_argument_hamdler,&local_20->_name);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string consumeOption(const option_info& optinfo)
    {
        std::string arg;
        switch (optinfo._type) {
            case option_info::type::no_arg:
                if (is_short_option(_current) && _current.length()>2) {
                    _current.erase(1,1);
                }
                else {
                    nextArg();
                }
                break;
            case option_info::type::arg_optional:
                if (is_short_option(_current) && _current.length() > 2) {
                        arg = _current.substr(2);
                        nextArg();
                }
                else if (!_next.empty() && _next[0] != '-') {
                    arg = _next;
                    nextArg(2);
                }
                else {
                    nextArg();
                }
                break;
            case option_info::type::arg_needed:
                if (is_short_option(_current) && _current.length() > 2) {
                    arg = _current.substr(2);
                    nextArg();
                }
                else if (!_next.empty() && _next[0] != '-') {
                    arg = _next;
                    nextArg(2);
                }
                else {
                    if (_missing_argument_hamdler) {
                        _missing_argument_hamdler(optinfo._name);
                    }
                    else {
                        throw std::runtime_error("Missing argument for option: " + optinfo._name);
                    }
                }
                break;
        }
        return arg;
    }